

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator+=
          (Fad<Fad<double>> *this,FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_> *x)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  Fad<Fad<double>_> *pFVar6;
  void *pvVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  value_type local_60;
  Fad<Fad<double>_> *local_40;
  long local_38;
  
  uVar1 = (((x->fadexpr_).left_)->dx_).num_elts;
  uVar12 = (ulong)uVar1;
  local_40 = (Fad<Fad<double>_> *)this;
  if (uVar12 != 0) {
    uVar2 = *(uint *)(this + 0x28);
    if ((ulong)uVar2 == 0) {
      Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),uVar1);
      pdVar8 = *(double **)(this + 0x30);
      if ((((x->fadexpr_).left_)->dx_).num_elts == 0) {
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::dx(&local_60,&x->fadexpr_,(int)uVar10)
            ;
            *pdVar8 = local_60.val_;
            Vector<double>::operator=((Vector<double> *)(pdVar8 + 1),&local_60.dx_);
            pdVar8[3] = local_60.defaultVal;
            Fad<double>::~Fad(&local_60);
            uVar10 = uVar10 + 1;
            pdVar8 = pdVar8 + 4;
          } while (uVar12 != uVar10);
        }
      }
      else if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                    (&local_60,&x->fadexpr_,(int)uVar10);
          *pdVar8 = local_60.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar8 + 1),&local_60.dx_);
          pdVar8[3] = local_60.defaultVal;
          Fad<double>::~Fad(&local_60);
          uVar10 = uVar10 + 1;
          pdVar8 = pdVar8 + 4;
        } while (uVar12 != uVar10);
      }
    }
    else if (0 < (int)uVar2) {
      local_38 = *(long *)(this + 0x30);
      uVar12 = 0;
      do {
        FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::fastAccessDx
                  (&local_60,&x->fadexpr_,(int)uVar12);
        pdVar5 = local_60.dx_.ptr_to_data;
        iVar4 = local_60.dx_.num_elts;
        pdVar8 = (double *)(local_38 + uVar12 * 0x20);
        lVar11 = (long)local_60.dx_.num_elts;
        if (lVar11 != 0) {
          uVar1 = *(uint *)(local_38 + 8 + uVar12 * 0x20);
          if ((ulong)uVar1 == 0) {
            *(int *)(pdVar8 + 1) = local_60.dx_.num_elts;
            uVar10 = lVar11 * 8;
            if (local_60.dx_.num_elts < 0) {
              uVar10 = 0xffffffffffffffff;
            }
            pvVar7 = operator_new__(uVar10);
            pdVar8[2] = (double)pvVar7;
            if (0 < iVar4) {
              lVar9 = 0;
              do {
                *(double *)((long)pvVar7 + lVar9 * 8) = pdVar5[lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar11 != lVar9);
            }
          }
          else if (0 < (int)uVar1) {
            dVar3 = pdVar8[2];
            uVar10 = 0;
            do {
              *(double *)((long)dVar3 + uVar10 * 8) =
                   local_60.dx_.ptr_to_data[uVar10] + *(double *)((long)dVar3 + uVar10 * 8);
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
          }
        }
        *pdVar8 = local_60.val_ + *pdVar8;
        Fad<double>::~Fad(&local_60);
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
    }
  }
  FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_60,&x->fadexpr_);
  pFVar6 = local_40;
  lVar11 = (long)local_60.dx_.num_elts;
  if (lVar11 != 0) {
    uVar1 = (local_40->val_).dx_.num_elts;
    if ((ulong)uVar1 == 0) {
      (local_40->val_).dx_.num_elts = local_60.dx_.num_elts;
      uVar12 = 0xffffffffffffffff;
      if (-1 < local_60.dx_.num_elts) {
        uVar12 = lVar11 * 8;
      }
      pdVar8 = (double *)operator_new__(uVar12);
      (pFVar6->val_).dx_.ptr_to_data = pdVar8;
      if (0 < local_60.dx_.num_elts) {
        lVar9 = 0;
        do {
          pdVar8[lVar9] = local_60.dx_.ptr_to_data[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar11 != lVar9);
      }
    }
    else if (0 < (int)uVar1) {
      pdVar8 = (local_40->val_).dx_.ptr_to_data;
      uVar12 = 0;
      do {
        pdVar8[uVar12] = local_60.dx_.ptr_to_data[uVar12] + pdVar8[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
    }
  }
  (pFVar6->val_).val_ = local_60.val_ + (pFVar6->val_).val_;
  Fad<double>::~Fad(&local_60);
  return pFVar6;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}